

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void google::protobuf::compiler::php::anon_unknown_2::GenerateEnumCInit
               (EnumDescriptor *desc,Printer *printer)

{
  char *pcVar1;
  lts_20250127 *this;
  size_type in_R9;
  string_view text;
  string_view s;
  FixedMapping replacements;
  string c_name;
  string local_50;
  char local_30 [8];
  char *local_28;
  undefined8 local_20;
  char *local_18;
  
  pcVar1 = (desc->all_names_).payload_;
  this = (lts_20250127 *)(ulong)*(ushort *)(pcVar1 + 2);
  s._M_len = pcVar1 + ~(ulong)this;
  local_30[0] = '\x01';
  local_30[1] = '\0';
  local_30[2] = '\0';
  local_30[3] = '\0';
  local_30[4] = '\0';
  local_30[5] = '\0';
  local_30[6] = '\0';
  local_30[7] = '\0';
  local_28 = ".";
  local_20 = 1;
  local_18 = "_";
  s._M_str = local_30;
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x1;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_(&local_50,this,s,replacements);
  text._M_str = "  $c_name$_ModuleInit();\n";
  text._M_len = 0x19;
  io::Printer::Print<char[7],std::__cxx11::string>(printer,text,(char (*) [7])0x134cf4f,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenerateEnumCInit(const EnumDescriptor* desc, io::Printer* printer) {
  std::string c_name = absl::StrReplaceAll(desc->full_name(), {{".", "_"}});

  printer->Print("  $c_name$_ModuleInit();\n", "c_name", c_name);
}